

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O0

void __thiscall
kj::(anonymous_namespace)::expectResImpl<kj::Array<wchar_t>,wchar_t>
          (_anonymous_namespace_ *this,EncodingResult<kj::Array<wchar_t>_> *result,
          ArrayPtr<const_wchar_t> expected,bool errors)

{
  wchar_t wVar1;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  WiderType<Decay<unsigned_long>,_Decay<unsigned_long>_> end;
  unsigned_long *puVar5;
  wchar_t *pwVar6;
  CappedArray<char,_9UL> local_b0;
  CappedArray<char,_9UL> local_98;
  bool local_79;
  size_t sStack_78;
  bool _kj_shouldLog_3;
  unsigned_long i;
  Iterator __end0;
  Iterator __begin0;
  size_t local_58;
  Range<unsigned_long> local_50;
  Range<unsigned_long> *local_40;
  Range<unsigned_long> *__range2;
  size_t local_30;
  bool local_24;
  bool local_23;
  bool local_22;
  byte local_21;
  bool _kj_shouldLog_2;
  bool _kj_shouldLog_1;
  bool _kj_shouldLog;
  _anonymous_namespace_ *p_Stack_20;
  bool errors_local;
  EncodingResult<kj::Array<wchar_t>_> *result_local;
  ArrayPtr<const_wchar_t> expected_local;
  
  expected_local.ptr = expected.ptr;
  local_21 = (byte)expected.size_ & 1;
  p_Stack_20 = this;
  result_local = result;
  if (((undefined1  [16])expected & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (((byte)this[0x18] & 1) != 0) {
      local_23 = _::Debug::shouldLog(ERROR);
      while (local_23 != false) {
        _::Debug::log<char_const(&)[35]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
                   ,0x2d,ERROR,"\"failed: expected \" \"!result.hadErrors\"",
                   (char (*) [35])"failed: expected !result.hadErrors");
        local_23 = false;
      }
    }
  }
  else if (((byte)this[0x18] & 1) == 0) {
    local_22 = _::Debug::shouldLog(ERROR);
    while (local_22 != false) {
      _::Debug::log<char_const(&)[34]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
                 ,0x2b,ERROR,"\"failed: expected \" \"result.hadErrors\"",
                 (char (*) [34])"failed: expected result.hadErrors");
      local_22 = false;
    }
  }
  sVar3 = Array<wchar_t>::size((Array<wchar_t> *)this);
  sVar4 = ArrayPtr<const_wchar_t>::size((ArrayPtr<const_wchar_t> *)&result_local);
  if (sVar3 != sVar4) {
    local_24 = _::Debug::shouldLog(ERROR);
    while (local_24 != false) {
      local_30 = Array<wchar_t>::size((Array<wchar_t> *)this);
      __range2 = (Range<unsigned_long> *)
                 ArrayPtr<const_wchar_t>::size((ArrayPtr<const_wchar_t> *)&result_local);
      _::Debug::log<char_const(&)[50],unsigned_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
                 ,0x30,ERROR,
                 "\"failed: expected \" \"result.size() == expected.size()\", result.size(), expected.size()"
                 ,(char (*) [50])"failed: expected result.size() == expected.size()",&local_30,
                 (unsigned_long *)&__range2);
      local_24 = false;
    }
  }
  local_58 = Array<wchar_t>::size((Array<wchar_t> *)this);
  __begin0.value = ArrayPtr<const_wchar_t>::size((ArrayPtr<const_wchar_t> *)&result_local);
  end = min<unsigned_long,unsigned_long>(&local_58,&__begin0.value);
  local_50 = zeroTo<unsigned_long>(end);
  local_40 = &local_50;
  __end0 = Range<unsigned_long>::begin(local_40);
  i = (unsigned_long)Range<unsigned_long>::end(local_40);
  while (bVar2 = Range<unsigned_long>::Iterator::operator!=(&__end0,(Iterator *)&i), bVar2) {
    puVar5 = Range<unsigned_long>::Iterator::operator*(&__end0);
    sStack_78 = *puVar5;
    pwVar6 = Array<wchar_t>::operator[]((Array<wchar_t> *)this,sStack_78);
    wVar1 = *pwVar6;
    pwVar6 = ArrayPtr<const_wchar_t>::operator[]((ArrayPtr<const_wchar_t> *)&result_local,sStack_78)
    ;
    if (wVar1 != *pwVar6) {
      local_79 = _::Debug::shouldLog(ERROR);
      while (local_79 != false) {
        pwVar6 = Array<wchar_t>::operator[]((Array<wchar_t> *)this,sStack_78);
        anon_unknown_0::hex(&local_98,*pwVar6);
        pwVar6 = ArrayPtr<const_wchar_t>::operator[]
                           ((ArrayPtr<const_wchar_t> *)&result_local,sStack_78);
        anon_unknown_0::hex(&local_b0,*pwVar6);
        _::Debug::
        log<char_const(&)[42],unsigned_long&,kj::CappedArray<char,9ul>,kj::CappedArray<char,9ul>>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
                   ,0x32,ERROR,
                   "\"failed: expected \" \"result[i] == expected[i]\", i, hex(result[i]), hex(expected[i])"
                   ,(char (*) [42])"failed: expected result[i] == expected[i]",
                   &stack0xffffffffffffff88,&local_98,&local_b0);
        local_79 = false;
      }
    }
    Range<unsigned_long>::Iterator::operator++(&__end0);
  }
  return;
}

Assistant:

void expectResImpl(EncodingResult<T> result,
                   ArrayPtr<const U> expected,
                   bool errors = false) {
  if (errors) {
    KJ_EXPECT(result.hadErrors);
  } else {
    KJ_EXPECT(!result.hadErrors);
  }

  KJ_EXPECT(result.size() == expected.size(), result.size(), expected.size());
  for (auto i: kj::zeroTo(kj::min(result.size(), expected.size()))) {
    KJ_EXPECT(result[i] == expected[i], i, hex(result[i]), hex(expected[i]));
  }
}